

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_type(FILE *out,Type *type,char should_print_struct_union)

{
  Type *pTVar1;
  size_t __size;
  char *pcVar2;
  
LAB_00145028:
  print_type_qualifier(out,type);
  switch(((Type_Function *)type)->specifier) {
  case TS_VOID:
    pcVar2 = "void";
LAB_0014518b:
    __size = 4;
LAB_00145190:
    fwrite(pcVar2,__size,1,(FILE *)out);
    return;
  case TS_CHAR:
    pcVar2 = "char";
    goto LAB_0014518b;
  case TS_INT:
    pcVar2 = "int";
    __size = 3;
    goto LAB_00145190;
  case TS_FLOAT:
    pcVar2 = "float";
    __size = 5;
    goto LAB_00145190;
  case TS_DOUBLE:
    pcVar2 = "double";
    break;
  case TS_STRUCT:
  case TS_UNION:
    if (should_print_struct_union == '\0') {
      pcVar2 = "union";
      if (((Type_Function *)type)->specifier == TS_STRUCT) {
        pcVar2 = "struct";
      }
      fprintf((FILE *)out,pcVar2);
      return;
    }
    print_struct_union(out,(Struct_Union *)((Type_Function *)type)->return_type);
    return;
  case TS_ENUM:
    pTVar1 = ((Type_Function *)type)->return_type;
    fwrite("enum ",5,1,(FILE *)out);
    print_list_of_denoted(out,(Queue *)pTVar1->node);
    return;
  case TS_POINTER:
    fwrite("pointer to ",0xb,1,(FILE *)out);
    type = (Type *)((Type_Function *)type)->number_of_arguments;
    should_print_struct_union = '\0';
    goto LAB_00145028;
  case TS_ARRAY:
    fprintf((FILE *)out,"array [%zu] of ",((Type_Function *)type)->number_of_arguments);
    type = (Type *)((Type_Function *)type)->arguments;
    goto LAB_00145028;
  case TS_FUNC:
    fwrite("function taking arguments (",0x1b,1,(FILE *)out);
    print_function_args(out,(Type_Function *)type);
    fwrite(") returning ",0xc,1,(FILE *)out);
    type = ((Type_Function *)type)->return_type;
    goto LAB_00145028;
  case TS_BITFIELD:
    goto switchD_00145047_caseD_b;
  case TS_NONE:
    pcVar2 = "NONE";
    goto LAB_0014518b;
  case TS_ERROR:
    pcVar2 = "ERROR!";
    break;
  default:
    __assert_fail("!\"reached end of switch\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                  ,0x1b1,"void print_type(FILE *, struct Type *, char)");
  }
  __size = 6;
  goto LAB_00145190;
switchD_00145047_caseD_b:
  fprintf((FILE *)out,"%zu bits of ",((Type_Function *)type)->return_type);
  type = (Type *)((Type_Function *)type)->number_of_arguments;
  goto LAB_00145028;
}

Assistant:

void print_type(FILE *out,struct Type *type,char should_print_struct_union)
{
	print_type_qualifier(out,type);
	switch(type->specifier)
	{
		case TS_VOID:
			fprintf(out,"void");return;
		case TS_CHAR:
			fprintf(out,"char");return;
		case TS_INT:
			fprintf(out,"int");return;
		case TS_FLOAT:
			fprintf(out,"float");return;
		case TS_DOUBLE:
			fprintf(out,"double");return;
		case TS_UNION:
		case TS_STRUCT:
			if(should_print_struct_union)
			{
				print_struct_union(out,((struct Type_Struct_Union*)type)->struct_union);
			}else
			{
				fprintf(out,(type->specifier==TS_STRUCT?"struct":"union"));
			}
			return;
		case TS_ENUM:
			print_enumeration(out,((struct Type_Enum*)type)->enumeration);
			return;
		case TS_POINTER:
			fprintf(out,"pointer to ");
			print_type(out,((struct Type_Pointer*)type)->points_to,0);
			return;
		case TS_ARRAY:
			fprintf(out,"array [%zu] of ",((struct Type_Array*)type)->number_of_elements);
			print_type(out,((struct Type_Array*)type)->is_array_of,should_print_struct_union);
			return;
		case TS_FUNC:
			fprintf(out,"function taking arguments (");
			print_function_args(out,(struct Type_Function*)type);
			fprintf(out,") returning ");
			print_type(out,((struct Type_Function*)type)->return_type,should_print_struct_union);
			return;
		case TS_BITFIELD:
			fprintf(out,"%zu bits of ",((struct Type_Bit_Field*)type)->number_of_bits);
			print_type(out,((struct Type_Bit_Field*)type)->base,should_print_struct_union);
			return;
		case TS_NONE:
			fprintf(out,"NONE");return;
		case TS_ERROR:
			fprintf(out,"ERROR!");return;

	}
	assert(!"reached end of switch");
}